

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

bool ON_TransformPointList(int dim,bool is_rat,int count,int stride,float *point,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  float *pfVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  if ((0 < dim) && ((point != (float *)0x0 && -1 < count) && (int)((uint)is_rat + dim) <= stride)) {
    bVar11 = true;
    if (count != 0) {
      if (is_rat) {
        dVar1 = xform->m_xform[0][0];
        if (dim == 1) {
          dVar4 = xform->m_xform[0][3];
          dVar2 = xform->m_xform[3][0];
          dVar3 = xform->m_xform[3][3];
          do {
            *(ulong *)point =
                 CONCAT44((float)((double)*point * dVar2 + (double)point[1] * dVar3),
                          (float)((double)*point * dVar1 + (double)point[1] * dVar4));
            point = point + (uint)stride;
            count = count + -1;
          } while (count != 0);
        }
        else if (dim == 2) {
          dVar6 = xform->m_xform[0][1];
          dVar7 = xform->m_xform[0][3];
          dVar2 = xform->m_xform[3][0];
          dVar3 = xform->m_xform[3][1];
          dVar4 = xform->m_xform[3][3];
          dVar16 = xform->m_xform[1][3];
          dVar18 = xform->m_xform[1][0];
          dVar5 = xform->m_xform[1][1];
          pfVar12 = point + 2;
          do {
            dVar14 = (double)pfVar12[-2];
            dVar15 = (double)pfVar12[-1];
            dVar17 = (double)*pfVar12;
            *(ulong *)(pfVar12 + -2) =
                 CONCAT44((float)(dVar17 * dVar16 + dVar14 * dVar18 + dVar15 * dVar5),
                          (float)(dVar17 * dVar7 + dVar14 * dVar1 + dVar15 * dVar6));
            *pfVar12 = (float)(dVar4 * dVar17 + dVar2 * dVar14 + dVar3 * dVar15);
            pfVar12 = pfVar12 + (uint)stride;
            count = count + -1;
          } while (count != 0);
        }
        else {
          dVar8 = xform->m_xform[0][1];
          dVar9 = xform->m_xform[0][2];
          dVar10 = xform->m_xform[0][3];
          dVar2 = xform->m_xform[2][0];
          dVar3 = xform->m_xform[2][1];
          dVar4 = xform->m_xform[2][2];
          dVar16 = xform->m_xform[2][3];
          dVar18 = xform->m_xform[3][0];
          dVar5 = xform->m_xform[3][1];
          dVar6 = xform->m_xform[3][2];
          dVar7 = xform->m_xform[3][3];
          dVar14 = xform->m_xform[1][3];
          dVar15 = xform->m_xform[1][2];
          dVar17 = xform->m_xform[1][0];
          dVar19 = xform->m_xform[1][1];
          do {
            dVar22 = (double)*point;
            dVar13 = (double)point[1];
            dVar20 = (double)point[2];
            dVar21 = (double)point[(uint)dim];
            *(ulong *)point =
                 CONCAT44((float)(dVar21 * dVar14 +
                                 dVar20 * dVar15 + dVar22 * dVar17 + dVar13 * dVar19),
                          (float)(dVar21 * dVar10 + dVar20 * dVar9 + dVar22 * dVar1 + dVar13 * dVar8
                                 ));
            point[2] = (float)(dVar16 * dVar21 + dVar4 * dVar20 + dVar2 * dVar22 + dVar3 * dVar13);
            point[(uint)dim] =
                 (float)(dVar7 * dVar21 + dVar6 * dVar20 + dVar18 * dVar22 + dVar5 * dVar13);
            point = point + (uint)stride;
            count = count + -1;
          } while (count != 0);
        }
      }
      else {
        dVar1 = xform->m_xform[3][0];
        if (dim == 1) {
          dVar2 = xform->m_xform[3][3];
          dVar3 = xform->m_xform[0][0];
          dVar4 = xform->m_xform[0][3];
          bVar11 = true;
          do {
            dVar18 = dVar1 * (double)*point + dVar2;
            dVar16 = 1.0 / dVar18;
            if ((dVar18 == 0.0) && (!NAN(dVar18))) {
              dVar16 = 1.0;
            }
            bVar11 = (bool)(bVar11 & dVar18 != 0.0);
            *point = (float)(((double)*point * dVar3 + dVar4) * dVar16);
            point = point + (uint)stride;
            count = count + -1;
          } while (count != 0);
        }
        else if (dim == 2) {
          dVar2 = xform->m_xform[3][1];
          dVar3 = xform->m_xform[3][3];
          dVar5 = xform->m_xform[0][0];
          dVar6 = xform->m_xform[0][1];
          dVar7 = xform->m_xform[0][3];
          dVar4 = xform->m_xform[1][3];
          dVar16 = xform->m_xform[1][0];
          dVar18 = xform->m_xform[1][1];
          bVar11 = true;
          do {
            dVar14 = (double)*point;
            dVar15 = (double)point[1];
            dVar19 = dVar1 * dVar14 + dVar2 * dVar15 + dVar3;
            dVar17 = 1.0 / dVar19;
            if ((dVar19 == 0.0) && (!NAN(dVar19))) {
              dVar17 = 1.0;
            }
            bVar11 = (bool)(bVar11 & dVar19 != 0.0);
            *(ulong *)point =
                 CONCAT44((float)(dVar17 * (dVar14 * dVar16 + dVar15 * dVar18 + dVar4)),
                          (float)(dVar17 * (dVar14 * dVar5 + dVar15 * dVar6 + dVar7)));
            point = point + (uint)stride;
            count = count + -1;
          } while (count != 0);
        }
        else {
          dVar2 = xform->m_xform[3][1];
          dVar3 = xform->m_xform[3][2];
          dVar4 = xform->m_xform[3][3];
          dVar19 = xform->m_xform[0][0];
          dVar8 = xform->m_xform[0][1];
          dVar9 = xform->m_xform[0][2];
          dVar10 = xform->m_xform[0][3];
          dVar16 = xform->m_xform[2][0];
          dVar18 = xform->m_xform[2][1];
          dVar5 = xform->m_xform[2][2];
          dVar6 = xform->m_xform[2][3];
          dVar7 = xform->m_xform[1][3];
          dVar14 = xform->m_xform[1][2];
          dVar15 = xform->m_xform[1][0];
          dVar17 = xform->m_xform[1][1];
          pfVar12 = point + 2;
          bVar11 = true;
          do {
            dVar22 = (double)pfVar12[-2];
            dVar20 = (double)pfVar12[-1];
            dVar23 = (double)*pfVar12;
            dVar13 = dVar3 * dVar23 + dVar1 * dVar22 + dVar2 * dVar20 + dVar4;
            dVar21 = 1.0 / dVar13;
            if ((dVar13 == 0.0) && (!NAN(dVar13))) {
              dVar21 = 1.0;
            }
            bVar11 = (bool)(bVar11 & dVar13 != 0.0);
            *(ulong *)(pfVar12 + -2) =
                 CONCAT44((float)(dVar21 * (dVar23 * dVar14 + dVar22 * dVar15 + dVar20 * dVar17 +
                                           dVar7)),
                          (float)(dVar21 * (dVar23 * dVar9 + dVar22 * dVar19 + dVar20 * dVar8 +
                                           dVar10)));
            *pfVar12 = (float)((dVar5 * dVar23 + dVar16 * dVar22 + dVar18 * dVar20 + dVar6) * dVar21
                              );
            pfVar12 = pfVar12 + (uint)stride;
            count = count + -1;
          } while (count != 0);
        }
      }
    }
    return bVar11;
  }
  return false;
}

Assistant:

bool 
ON_IsValidPointList(
       int dim,
       bool is_rat,
       int count,
       int stride,
       const float* p
       )
{
  return ( dim > 0 && stride >= (is_rat?(dim+1):dim) && count >= 0 && p != nullptr ) ? true : false;
}